

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_data_source_get_length_in_pcm_frames(ma_data_source *pDataSource,ma_uint64 *pLength)

{
  ma_data_source_base *pDataSourceBase;
  ma_uint64 *pLength_local;
  ma_data_source *pDataSource_local;
  
  if (pLength == (ma_uint64 *)0x0) {
    pDataSource_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0;
    if (pDataSource == (ma_data_source *)0x0) {
      pDataSource_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (*(long *)((long)pDataSource + 0x10) == -1) {
      if (*(long *)(*pDataSource + 0x20) == 0) {
        pDataSource_local._4_4_ = MA_NOT_IMPLEMENTED;
      }
      else {
        pDataSource_local._4_4_ = (**(code **)(*pDataSource + 0x20))(pDataSource,pLength);
      }
    }
    else {
      *pLength = *(long *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8);
      pDataSource_local._4_4_ = MA_SUCCESS;
    }
  }
  return pDataSource_local._4_4_;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_pcm_frames(ma_data_source* pDataSource, ma_uint64* pLength)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    If we have a range defined we'll use that to determine the length. This is one of rare times
    where we'll actually trust the caller. If they've set the range, I think it's mostly safe to
    assume they've set it based on some higher level knowledge of the structure of the sound bank.
    */
    if (pDataSourceBase->rangeEndInFrames != ~((ma_uint64)0)) {
        *pLength = pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames;
        return MA_SUCCESS;
    }

    /*
    Getting here means a range is not defined so we'll need to get the data source itself to tell
    us the length.
    */
    if (pDataSourceBase->vtable->onGetLength == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pDataSourceBase->vtable->onGetLength(pDataSource, pLength);
}